

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_expectMultipleCallsWithParameters_Test::testBody
          (TEST_MockParameterTest_expectMultipleCallsWithParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SimpleString SStack_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,&local_28);
  SimpleString::SimpleString(&local_38,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x88))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var,iVar1),&local_38);
  SimpleString::SimpleString(&local_48,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x58))(plVar3,&local_48,0xfffffffffffffff9);
  SimpleString::SimpleString(&local_58,"string");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x98))(plVar3,&local_58,"string");
  SimpleString::SimpleString(&SStack_68,"uint");
  (**(code **)(*plVar3 + 0x60))(plVar3,&SStack_68,7);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_00,iVar1),&local_38);
  SimpleString::SimpleString(&local_48,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_48,0xfffffffffffffff9);
  SimpleString::SimpleString(&local_58,"string");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3,&local_58,"string");
  SimpleString::SimpleString(&SStack_68,"uint");
  (**(code **)(*plVar3 + 0x48))(plVar3,&SStack_68,7);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_01,iVar1),&local_38);
  SimpleString::SimpleString(&local_48,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_48,0xfffffffffffffff9);
  SimpleString::SimpleString(&local_58,"string");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x78))(plVar3,&local_58,"string");
  SimpleString::SimpleString(&SStack_68,"uint");
  (**(code **)(*plVar3 + 0x48))(plVar3,&SStack_68,7);
  SimpleString::~SimpleString(&SStack_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleCallsWithParameters)
{
    int expected_int = -7;
    unsigned int expected_uint = 7;

    mock().expectNCalls(2, "boo").withParameter("double", 1.0).withParameter("int", expected_int).
        withParameter("string", "string").withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);

    mock().checkExpectations();
}